

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

BOOL JS_IsCFunction(JSContext *ctx,JSValue val,JSCFunction *func,int magic)

{
  JSValueUnion JVar1;
  
  JVar1 = val.u;
  if ((((int)val.tag == -1) && (*(short *)((long)JVar1.ptr + 6) == 0xc)) &&
     (*(JSCFunction **)((long)JVar1.ptr + 0x38) == func)) {
    return (BOOL)(*(short *)((long)JVar1.ptr + 0x42) == magic);
  }
  return 0;
}

Assistant:

BOOL JS_IsCFunction(JSContext *ctx, JSValueConst val, JSCFunction *func, int magic)
{
    JSObject *p;
    if (JS_VALUE_GET_TAG(val) != JS_TAG_OBJECT)
        return FALSE;
    p = JS_VALUE_GET_OBJ(val);
    if (p->class_id == JS_CLASS_C_FUNCTION)
        return (p->u.cfunc.c_function.generic == func && p->u.cfunc.magic == magic);
    else
        return FALSE;
}